

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Collection.cpp
# Opt level: O0

ValueLength arangodb::velocypack::Collection::indexOf(Slice slice,Slice other)

{
  bool bVar1;
  Slice in_RDI;
  ValueLength index;
  ArrayIterator it;
  ArrayIterator *in_stack_ffffffffffffffb8;
  ArrayIterator *this;
  SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *in_stack_ffffffffffffffd8;
  SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *in_stack_ffffffffffffffe0;
  
  ArrayIterator::ArrayIterator(in_stack_ffffffffffffffb8,in_RDI);
  this = (ArrayIterator *)0x0;
  while( true ) {
    bVar1 = ArrayIterator::valid((ArrayIterator *)&stack0xffffffffffffffc8);
    if (!bVar1) {
      return 0xffffffffffffffff;
    }
    ArrayIterator::value(this);
    bVar1 = SliceBase<arangodb::velocypack::Slice,arangodb::velocypack::Slice>::
            binaryEquals<arangodb::velocypack::Slice,arangodb::velocypack::Slice>
                      (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    if (bVar1) break;
    ArrayIterator::next((ArrayIterator *)in_RDI._start);
    this = (ArrayIterator *)((long)&(this->_slice)._start + 1);
  }
  return (ValueLength)this;
}

Assistant:

ValueLength Collection::indexOf(Slice slice, Slice other) {
  ArrayIterator it(slice);
  ValueLength index = 0;

  while (it.valid()) {
    if (it.value().binaryEquals(other)) {
      return index;
    }
    it.next();
    ++index;
  }

  return Collection::NotFound;
}